

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O3

void __thiscall PF_BufferMgr::~PF_BufferMgr(PF_BufferMgr *this)

{
  void *pvVar1;
  StatisticsMgr *pSVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  iVar3 = this->numPages;
  if (0 < iVar3) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      pvVar1 = *(void **)((long)&this->bufTable->pData + lVar4);
      if (pvVar1 != (void *)0x0) {
        operator_delete__(pvVar1);
        iVar3 = this->numPages;
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x20;
    } while (lVar5 < iVar3);
  }
  if (this->bufTable != (PF_BufPageDesc *)0x0) {
    operator_delete__(this->bufTable);
  }
  pSVar2 = pStatisticsMgr;
  if (pStatisticsMgr != (StatisticsMgr *)0x0) {
    StatisticsMgr::~StatisticsMgr(pStatisticsMgr);
  }
  operator_delete(pSVar2);
  PF_HashTable::~PF_HashTable(&this->hashTable);
  return;
}

Assistant:

PF_BufferMgr::~PF_BufferMgr()
{
   // Free up buffer pages and tables
   for (int i = 0; i < this->numPages; i++)
      delete [] bufTable[i].pData;

   delete [] bufTable;

#ifdef PF_STATS
   // Destroy the global statistics manager
   delete pStatisticsMgr;
#endif

#ifdef PF_LOG
   WriteLog("Destroyed the buffer manager.\n");
#endif
}